

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

FieldDescriptor *
google::protobuf::compiler::js::anon_unknown_0::MapFieldKey(FieldDescriptor *field)

{
  bool bVar1;
  Descriptor *this;
  FieldDescriptor *pFVar2;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_map(field);
  if (!bVar1) {
    __assert_fail("field->is_map()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                  ,0x4e7,
                  "const FieldDescriptor *google::protobuf::compiler::js::(anonymous namespace)::MapFieldKey(const FieldDescriptor *)"
                 );
  }
  this = FieldDescriptor::message_type(field);
  pFVar2 = Descriptor::FindFieldByNumber(this,1);
  return pFVar2;
}

Assistant:

const FieldDescriptor* MapFieldKey(const FieldDescriptor* field) {
  assert(field->is_map());
  return field->message_type()->FindFieldByNumber(kMapKeyField);
}